

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bels.c
# Opt level: O2

err_t belsValM(octet *m0,size_t len)

{
  size_t n;
  bool_t bVar1;
  size_t sVar2;
  u64 *dest;
  err_t eVar3;
  
  eVar3 = 0x6d;
  if ((len < 0x21) && ((0x101010000U >> (len & 0x3f) & 1) != 0)) {
    bVar1 = memIsValid(m0,len);
    if (bVar1 != 0) {
      n = (len >> 3) + 1;
      sVar2 = ppIsIrred_deep(n);
      dest = (u64 *)blobCreate(sVar2 + (len >> 3) + 1);
      if (dest == (u64 *)0x0) {
        eVar3 = 0x6e;
      }
      else {
        u64From(dest,m0,len);
        *(undefined8 *)((long)dest + len) = 1;
        bVar1 = ppIsIrred(dest,n,(void *)((long)dest + len + 8));
        eVar3 = 0x1f9;
        if (bVar1 != 0) {
          eVar3 = 0;
        }
        blobClose(dest);
      }
    }
  }
  return eVar3;
}

Assistant:

err_t belsValM(const octet m0[], size_t len)
{
	size_t n;
	void* state;
	word* f0;
	void* stack;
	err_t code;
	// проверить входные данные
	if ((len != 16 && len != 24 && len != 32) || !memIsValid(m0, len))
		return ERR_BAD_INPUT;
	// создать состояние
	n = W_OF_O(len);
	state = blobCreate(n + 1 + ppIsIrred_deep(n + 1));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	f0 = (word*)state;
	stack = f0 + n + 1;
	// загрузить многочлен
	wwFrom(f0, m0, len);
	f0[n] = 1;
	// неприводим?
	code = ppIsIrred(f0, n + 1, stack) ? ERR_OK : ERR_BAD_PUBKEY;
	// завершение
	blobClose(state);
	return code;
}